

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GreaterThanTests.cpp
# Opt level: O3

void __thiscall IsNotGreaterThanTests::~IsNotGreaterThanTests(IsNotGreaterThanTests *this)

{
  ut11::TestFixture::~TestFixture(&this->super_TestFixture);
  operator_delete(this);
  return;
}

Assistant:

virtual void Run()
	{
		Then("Is::Not::GreaterThan(5)(12) is Not::True", []()
		{
			AssertThat(ut11::Is::Not::GreaterThan(5)(12), ut11::Is::Not::True);
		});

		Then("Is::Not::GreaterThan(5)(5) is Not::False", []()
		{
			AssertThat(ut11::Is::Not::GreaterThan(5)(5), ut11::Is::Not::False);
		});

		Then("Is::Not::GreaterThan(5)(3) is Not::False", []()
		{
			AssertThat(ut11::Is::Not::GreaterThan(5)(3), ut11::Is::Not::False);
		});

		Then("Is::Not::GreaterThan is an operand", []()
		{
			AssertThat(ut11::detail::IsOperand< decltype(ut11::Is::Not::GreaterThan(5)) >::value, ut11::Is::True);
		});

		Then("Is::Not::GreaterThan has an error message", []() {
			AssertThat(ut11::Is::Not::GreaterThan(5).GetErrorMessage(5), ut11::Is::Not::EqualTo(""));
		});
	}